

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::initBuffer
               (Functions *gl,GLuint seed,GLenum usage,GLuint buffer)

{
  GLenum err;
  long lVar1;
  float fVar2;
  GLfloat *vertex;
  float local_68;
  int ndx;
  GLfloat data [12];
  undefined1 local_2c [8];
  Random rnd;
  GLuint buffer_local;
  GLenum usage_local;
  GLuint seed_local;
  Functions *gl_local;
  
  rnd.m_rnd.z = buffer;
  rnd.m_rnd.w = usage;
  (*gl->bindBuffer)(0x8892,buffer);
  if (seed == 0) {
    (*gl->bufferData)(0x8892,0x30,Functional::(anonymous_namespace)::s_varrData,rnd.m_rnd.w);
  }
  else {
    de::Random::Random((Random *)local_2c,seed);
    for (vertex._4_4_ = 0; vertex._4_4_ < 3; vertex._4_4_ = vertex._4_4_ + 1) {
      lVar1 = (long)(vertex._4_4_ << 2);
      fVar2 = de::Random::getFloat((Random *)local_2c);
      (&local_68)[lVar1] = fVar2 + -0.5 + fVar2 + -0.5;
      fVar2 = de::Random::getFloat((Random *)local_2c);
      data[lVar1 + -1] = (fVar2 - 0.5) * 2.0;
      data[lVar1] = 0.0;
      data[lVar1 + 1] = 1.0;
    }
    (*gl->bufferData)(0x8892,0x30,&local_68,rnd.m_rnd.w);
    de::Random::~Random((Random *)local_2c);
  }
  (*gl->bindBuffer)(0x8892,0);
  err = (*gl->getError)();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0xfe);
  return;
}

Assistant:

void initBuffer (const Functions& gl, GLuint seed, GLenum usage, GLuint buffer)
{
	gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
	if (seed == 0)
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_varrData), s_varrData, usage);
	else
	{
		Random	rnd	(seed);
		GLfloat data[DE_LENGTH_OF_ARRAY(s_varrData)];

		for (int ndx = 0; ndx < NUM_VERTICES; ndx++)
		{
			GLfloat* vertex = &data[ndx * NUM_COMPONENTS];
			vertex[0] = 2.0f * (rnd.getFloat() - 0.5f);
			vertex[1] = 2.0f * (rnd.getFloat() - 0.5f);
			DE_STATIC_ASSERT(NUM_COMPONENTS == 4);
			vertex[2] = 0.0f;
			vertex[3] = 1.0f;
		}
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, usage);
	}
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());
}